

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CETestSuite.cpp
# Opt level: O3

bool __thiscall
CETestSuite::test_double
          (CETestSuite *this,double *value,double *expected,string *function,int *line)

{
  undefined8 *puVar1;
  long *plVar2;
  undefined8 *puVar3;
  long *plVar4;
  ulong *puVar5;
  ulong uVar6;
  undefined8 uVar7;
  undefined1 local_1b1;
  ulong *local_1b0;
  long local_1a8;
  ulong local_1a0;
  long lStack_198;
  undefined8 *local_190;
  undefined8 local_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 *local_170;
  undefined8 local_168;
  undefined8 local_160;
  undefined8 uStack_158;
  ulong *local_150;
  long local_148;
  ulong local_140;
  long lStack_138;
  string *local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  long *local_e8;
  long local_e0;
  long local_d8;
  long lStack_d0;
  long *local_c8;
  long local_c0;
  long local_b8;
  long lStack_b0;
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  double local_68;
  undefined8 uStack_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_1b1 = 1;
  local_68 = ABS(this->tol_dbl_ * *expected);
  uStack_60 = 0;
  if (ABS(*value - *expected) <= local_68) {
    local_130 = (string *)line;
    __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_50,vsnprintf,0x148,"%f");
    puVar3 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x107054);
    plVar2 = puVar3 + 2;
    if ((long *)*puVar3 == plVar2) {
      local_b8 = *plVar2;
      lStack_b0 = puVar3[3];
      local_c8 = &local_b8;
    }
    else {
      local_b8 = *plVar2;
      local_c8 = (long *)*puVar3;
    }
    local_c0 = puVar3[1];
    *puVar3 = plVar2;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_c8);
    plVar2 = puVar3 + 2;
    if ((long *)*puVar3 == plVar2) {
      local_98 = *plVar2;
      lStack_90 = puVar3[3];
      local_a8 = &local_98;
    }
    else {
      local_98 = *plVar2;
      local_a8 = (long *)*puVar3;
    }
    local_a0 = puVar3[1];
    *puVar3 = plVar2;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_a8);
    puVar5 = puVar3 + 2;
    if ((ulong *)*puVar3 == puVar5) {
      local_1a0 = *puVar5;
      lStack_198 = puVar3[3];
      local_1b0 = &local_1a0;
    }
    else {
      local_1a0 = *puVar5;
      local_1b0 = (ulong *)*puVar3;
    }
    local_1a8 = puVar3[1];
    *puVar3 = puVar5;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_108,vsnprintf,0x148,"%f",local_68);
    uVar6 = 0xf;
    if (local_1b0 != &local_1a0) {
      uVar6 = local_1a0;
    }
    if (uVar6 < local_108._M_string_length + local_1a8) {
      uVar7 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        uVar7 = local_108.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar7 < local_108._M_string_length + local_1a8) goto LAB_00102947;
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_108,0,(char *)0x0,(ulong)local_1b0);
    }
    else {
LAB_00102947:
      puVar3 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_1b0,(ulong)local_108._M_dataplus._M_p)
      ;
    }
    local_190 = &local_180;
    puVar1 = puVar3 + 2;
    if ((undefined8 *)*puVar3 == puVar1) {
      local_180 = *puVar1;
      uStack_178 = puVar3[3];
    }
    else {
      local_180 = *puVar1;
      local_190 = (undefined8 *)*puVar3;
    }
    local_188 = puVar3[1];
    *puVar3 = puVar1;
    puVar3[1] = 0;
    *(undefined1 *)puVar1 = 0;
    puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_190);
    local_e8 = &local_d8;
    plVar2 = puVar3 + 2;
    if ((long *)*puVar3 == plVar2) {
      local_d8 = *plVar2;
      lStack_d0 = puVar3[3];
    }
    else {
      local_d8 = *plVar2;
      local_e8 = (long *)*puVar3;
    }
    local_e0 = puVar3[1];
    *puVar3 = plVar2;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_e8);
    puVar5 = puVar3 + 2;
    if ((ulong *)*puVar3 == puVar5) {
      local_140 = *puVar5;
      lStack_138 = puVar3[3];
      local_150 = &local_140;
    }
    else {
      local_140 = *puVar5;
      local_150 = (ulong *)*puVar3;
    }
    local_148 = puVar3[1];
    *puVar3 = puVar5;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_128,vsnprintf,0x148,"%f",*expected);
    uVar6 = 0xf;
    if (local_150 != &local_140) {
      uVar6 = local_140;
    }
    if (uVar6 < local_128._M_string_length + local_148) {
      uVar7 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        uVar7 = local_128.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar7 < local_128._M_string_length + local_148) goto LAB_00102c8d;
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_128,0,(char *)0x0,(ulong)local_150);
    }
    else {
LAB_00102c8d:
      puVar3 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_128._M_dataplus._M_p)
      ;
    }
    local_170 = &local_160;
    puVar1 = puVar3 + 2;
    if ((undefined8 *)*puVar3 == puVar1) {
      local_160 = *puVar1;
      uStack_158 = puVar3[3];
    }
    else {
      local_160 = *puVar1;
      local_170 = (undefined8 *)*puVar3;
    }
    local_168 = puVar3[1];
    *puVar3 = puVar1;
    puVar3[1] = 0;
    *(undefined1 *)puVar1 = 0;
    puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_170);
    plVar2 = puVar3 + 2;
    if ((long *)*puVar3 == plVar2) {
      local_78 = *plVar2;
      lStack_70 = puVar3[3];
      local_88 = &local_78;
    }
    else {
      local_78 = *plVar2;
      local_88 = (long *)*puVar3;
    }
    local_80 = puVar3[1];
    *puVar3 = plVar2;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    printf("- Fnc: %s, ln %d\n",(function->_M_dataplus)._M_p,
           (ulong)*(uint *)&(local_130->_M_dataplus)._M_p);
    printf("  [x] %s\n",local_88);
    if (local_88 != &local_78) {
      operator_delete(local_88);
    }
    if (local_170 != &local_160) {
      operator_delete(local_170);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p);
    }
    if (local_150 != &local_140) {
      operator_delete(local_150);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8);
    }
    if (local_190 != &local_180) {
      operator_delete(local_190);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p);
    }
    if (local_1b0 != &local_1a0) {
      operator_delete(local_1b0);
    }
    if (local_a8 != &local_98) {
      operator_delete(local_a8);
    }
    if (local_c8 != &local_b8) {
      operator_delete(local_c8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    local_1b1 = 1;
    goto LAB_00103040;
  }
  local_130 = function;
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_50,vsnprintf,0x148,"%f");
  plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x107054);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_b8 = *plVar4;
    lStack_b0 = plVar2[3];
    local_c8 = &local_b8;
  }
  else {
    local_b8 = *plVar4;
    local_c8 = (long *)*plVar2;
  }
  local_c0 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_c8);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_98 = *plVar4;
    lStack_90 = plVar2[3];
    local_a8 = &local_98;
  }
  else {
    local_98 = *plVar4;
    local_a8 = (long *)*plVar2;
  }
  local_a0 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_a8);
  puVar5 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar5) {
    local_1a0 = *puVar5;
    lStack_198 = plVar2[3];
    local_1b0 = &local_1a0;
  }
  else {
    local_1a0 = *puVar5;
    local_1b0 = (ulong *)*plVar2;
  }
  local_1a8 = plVar2[1];
  *plVar2 = (long)puVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_108,vsnprintf,0x148,"%f",local_68);
  uVar6 = 0xf;
  if (local_1b0 != &local_1a0) {
    uVar6 = local_1a0;
  }
  if (uVar6 < local_108._M_string_length + local_1a8) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      uVar7 = local_108.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar7 < local_108._M_string_length + local_1a8) goto LAB_00102896;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_108,0,(char *)0x0,(ulong)local_1b0);
  }
  else {
LAB_00102896:
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_1b0,(ulong)local_108._M_dataplus._M_p);
  }
  local_190 = &local_180;
  puVar1 = puVar3 + 2;
  if ((undefined8 *)*puVar3 == puVar1) {
    local_180 = *puVar1;
    uStack_178 = puVar3[3];
  }
  else {
    local_180 = *puVar1;
    local_190 = (undefined8 *)*puVar3;
  }
  local_188 = puVar3[1];
  *puVar3 = puVar1;
  puVar3[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_190);
  local_e8 = &local_d8;
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_d8 = *plVar4;
    lStack_d0 = plVar2[3];
  }
  else {
    local_d8 = *plVar4;
    local_e8 = (long *)*plVar2;
  }
  local_e0 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_e8);
  puVar5 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar5) {
    local_140 = *puVar5;
    lStack_138 = plVar2[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar5;
    local_150 = (ulong *)*plVar2;
  }
  local_148 = plVar2[1];
  *plVar2 = (long)puVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_128,vsnprintf,0x148,"%f",*expected);
  uVar6 = 0xf;
  if (local_150 != &local_140) {
    uVar6 = local_140;
  }
  if (uVar6 < local_128._M_string_length + local_148) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      uVar7 = local_128.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar7 < local_128._M_string_length + local_148) goto LAB_00102aea;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_128,0,(char *)0x0,(ulong)local_150);
  }
  else {
LAB_00102aea:
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_128._M_dataplus._M_p);
  }
  local_170 = &local_160;
  puVar1 = puVar3 + 2;
  if ((undefined8 *)*puVar3 == puVar1) {
    local_160 = *puVar1;
    uStack_158 = puVar3[3];
  }
  else {
    local_160 = *puVar1;
    local_170 = (undefined8 *)*puVar3;
  }
  local_168 = puVar3[1];
  *puVar3 = puVar1;
  puVar3[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_170);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_78 = *plVar4;
    lStack_70 = plVar2[3];
    local_88 = &local_78;
  }
  else {
    local_78 = *plVar4;
    local_88 = (long *)*plVar2;
  }
  local_80 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  printf("- Fnc: %s, ln %d\n",(local_130->_M_dataplus)._M_p,(ulong)(uint)*line);
  printf("  [ ] %s\n",local_88);
  if (local_88 != &local_78) {
    operator_delete(local_88);
  }
  if (local_170 != &local_160) {
    operator_delete(local_170);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150);
  }
  if (local_e8 != &local_d8) {
    operator_delete(local_e8);
  }
  if (local_190 != &local_180) {
    operator_delete(local_190);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  if (local_1b0 != &local_1a0) {
    operator_delete(local_1b0);
  }
  if (local_a8 != &local_98) {
    operator_delete(local_a8);
  }
  if (local_c8 != &local_b8) {
    operator_delete(local_c8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_1b1 = 0;
LAB_00103040:
  (*this->_vptr_CETestSuite[0xf])(this,&local_1b1);
  return (bool)local_1b1;
}

Assistant:

bool CETestSuite::test_double(const double&      value, 
                              const double&      expected,
                              const std::string& function,
                              const int&         line)
{
    // Return status
    bool   ret_val      = true;
    double relative_tol = std::fabs(expected * tol_dbl_);

    // Values equal within tolerance
    if (std::fabs(value - expected) <= relative_tol) {
        log_success("DOUBLE value of "+std::to_string(value)+" is within " +
                    "tolerance of "+std::to_string(relative_tol)+" of " +
                    "expected value "+std::to_string(expected)+".",
                    function, line);
        ret_val = true;
    } 
    // Values not within tolerance
    else {
        log_failure("DOUBLE value of "+std::to_string(value)+" is NOT within " +
                    "tolerance of "+std::to_string(relative_tol)+" of " +
                    "expected value "+std::to_string(expected)+".",
                    function, line);
        ret_val = false;
    }

    update_pass(ret_val);
    return ret_val;
}